

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_interpolate.cpp
# Opt level: O1

void __thiscall
DWallScrollInterpolation::Interpolate(DWallScrollInterpolation *this,double smoothratio)

{
  double dVar1;
  double dVar2;
  int iVar3;
  side_t *psVar4;
  
  psVar4 = this->side;
  iVar3 = this->part;
  dVar1 = psVar4->textures[iVar3].xOffset;
  this->bakx = dVar1;
  dVar2 = psVar4->textures[iVar3].yOffset;
  this->baky = dVar2;
  if ((((this->super_DInterpolation).refcount == 0) && (this->oldx == dVar1)) &&
     (!NAN(this->oldx) && !NAN(dVar1))) {
    if ((this->oldy == dVar2) && (!NAN(this->oldy) && !NAN(dVar2))) {
      (*(this->super_DInterpolation).super_DObject._vptr_DObject[4])();
      return;
    }
  }
  psVar4->textures[iVar3].xOffset = (dVar1 - this->oldx) * smoothratio + this->oldx;
  psVar4->textures[iVar3].yOffset = (dVar2 - this->oldy) * smoothratio + this->oldy;
  return;
}

Assistant:

void DWallScrollInterpolation::Interpolate(double smoothratio)
{
	bakx = side->GetTextureXOffset(part);
	baky = side->GetTextureYOffset(part);

	if (refcount == 0 && oldx == bakx && oldy == baky)
	{
		Destroy();
	}
	else
	{
		side->SetTextureXOffset(part, oldx + (bakx - oldx) * smoothratio);
		side->SetTextureYOffset(part, oldy + (baky - oldy) * smoothratio);
	}
}